

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

void __thiscall tcmalloc::PageHeap::MergeIntoFreeList(PageHeap *this,Span *span)

{
  bool bVar1;
  Span *span_00;
  uint64_t uVar2;
  uint64_t released_pages;
  uint64_t old_npages;
  Span *span_local;
  PageHeap *this_local;
  
  uVar2 = span->npages;
  if (span->location != 0) {
    __assert_fail("span->location == Span::IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0xd0,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  (this->stat).in_used_bytes = (this->stat).in_used_bytes + span->npages * -0x2000;
  span->location = 1;
  bVar1 = CheckSmallList(this);
  if (!bVar1) {
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0xd5,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  span_00 = MergePrevAndNextSpans(this,span);
  bVar1 = CheckSmallList(this);
  if (!bVar1) {
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0xd7,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  InsertToFreeList(this,span_00);
  bVar1 = CheckSmallList(this);
  if (bVar1) {
    this->release_rate_ = this->release_rate_ - uVar2;
    if (this->release_rate_ < 1) {
      uVar2 = ReleaseNormalSpans(this,1);
      if (uVar2 == 0) {
        this->release_rate_ = 100;
      }
      else {
        this->release_rate_ = uVar2 * 100;
      }
    }
    bVar1 = CheckSmallList(this);
    if (bVar1) {
      return;
    }
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0xe5,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                ,0xd9,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
}

Assistant:

void MergeIntoFreeList(Span* span) {
        uint64_t old_npages = span->npages;
        assert(span->location == Span::IN_USE);
        stat.in_used_bytes -= span->npages * spanPageSize;
        span->location = Span::IN_NORMAL;

        // 尝试合并相邻span
        assert(CheckSmallList());
        span = MergePrevAndNextSpans(span);
        assert(CheckSmallList());
        InsertToFreeList(span);
        assert(CheckSmallList());

        // 检查是否需要释放normal状态的span
        release_rate_ -= old_npages;
        if (release_rate_ <= 0) {
            uint64_t released_pages = ReleaseNormalSpans(1);
            if (released_pages > 0) {
                release_rate_ = released_pages * 100;
            } else {
                release_rate_ = 100;
            }
        }
        assert(CheckSmallList());
    }